

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
TPZParFrontMatrix(TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                  *this)

{
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
  *unaff_retaddr;
  int64_t newsize;
  TPZManVector<TPZEqnArray<long_double>_*,_10> *this_00;
  TPZRegisterClassId *vtt;
  
  this_00 = (TPZManVector<TPZEqnArray<long_double>_*,_10> *)0x0;
  newsize = 0x21;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<long_double,TPZStackEqnStorage<long_double>,TPZFrontNonSym<long_double>>>
            (in_RDI,0x21);
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
  TPZFrontMatrix(unaff_retaddr,(void **)vtt);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_02553be8;
  TPZStack<TPZEqnArray<long_double>_*,_10>::TPZStack
            ((TPZStack<TPZEqnArray<long_double>_*,_10> *)(in_RDI + 0x33488));
  *(undefined4 *)(in_RDI + 0x334f8) = 0;
  *(undefined8 *)(in_RDI + 0x33510) = 0;
  *(undefined8 *)(in_RDI + 0x33518) = 0;
  *(undefined8 *)(in_RDI + 0x33500) = 0;
  *(undefined8 *)(in_RDI + 0x33508) = 0;
  *(undefined8 *)(in_RDI + 0x33520) = 0;
  std::mutex::mutex((mutex *)0x1d40b99);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x33528));
  TPZManVector<TPZEqnArray<long_double>_*,_10>::Resize(this_00,newsize);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix():
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}